

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring64.c
# Opt level: O2

roaring64_bitmap_t * roaring64_bitmap_copy(roaring64_bitmap_t *r)

{
  roaring64_bitmap_t *r_00;
  container_t *container;
  leaf_t val;
  uint8_t result_typecode;
  art_iterator_t it;
  
  r_00 = roaring64_bitmap_create();
  art_init_iterator(&it,&r->art,true);
  while (it.value != (art_val_t *)0x0) {
    result_typecode = (uint8_t)*it.value;
    container = get_copy_of_container(r->containers[*it.value >> 8],&result_typecode,false);
    val = add_container(r_00,container,result_typecode);
    art_insert(&r_00->art,it.key,val);
    art_iterator_next(&it);
  }
  return r_00;
}

Assistant:

roaring64_bitmap_t *roaring64_bitmap_copy(const roaring64_bitmap_t *r) {
    roaring64_bitmap_t *result = roaring64_bitmap_create();

    art_iterator_t it = art_init_iterator((art_t *)&r->art, /*first=*/true);
    while (it.value != NULL) {
        leaf_t leaf = (leaf_t)*it.value;
        uint8_t result_typecode = get_typecode(leaf);
        container_t *result_container = get_copy_of_container(
            get_container(r, leaf), &result_typecode, /*copy_on_write=*/false);
        leaf_t result_leaf =
            add_container(result, result_container, result_typecode);
        art_insert(&result->art, it.key, (art_val_t)result_leaf);
        art_iterator_next(&it);
    }
    return result;
}